

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

tuple<double,_long>
findBestCC(TKeyWaveformF *waveform0,TKeyWaveformF *waveform1,int is0,int is1,int alignWindow)

{
  float fVar1;
  pointer pfVar2;
  _Tuple_impl<1UL,_long> _Var3;
  uint uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  size_type __n;
  int iVar6;
  iterator __begin1;
  pointer ptVar7;
  pointer ptVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  tuple<double,_long> tVar9;
  int nWorkers;
  int is00;
  TValueCC bestcc;
  TOffset besto;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  mutex mutex;
  long *local_c0;
  undefined4 local_b4;
  int local_b0;
  undefined1 local_ac [4];
  int local_a8;
  int local_a4;
  thread local_a0;
  pointer local_98;
  undefined8 local_90;
  _Tuple_impl<1UL,_long> local_88;
  vector<std::thread,_std::allocator<std::thread>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = 0xffffffffffffffff;
  local_98 = (pointer)0xbff0000000000000;
  pfVar2 = (waveform1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = (int)((ulong)((long)(waveform1->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3) -
             (alignWindow - is1) / 2;
  iVar6 = (alignWindow - is1) + local_b0;
  local_68 = 0.0;
  uStack_60 = 0.0;
  if (local_b0 < iVar6) {
    lVar5 = (long)local_b0;
    do {
      fVar1 = pfVar2[lVar5];
      local_68 = local_68 + (double)fVar1;
      uStack_60 = uStack_60 + (double)(fVar1 * fVar1);
      lVar5 = lVar5 + 1;
    } while (iVar6 != lVar5);
  }
  local_a8 = alignWindow;
  local_a4 = is1;
  local_88.super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform0;
  uVar4 = std::thread::hardware_concurrency();
  __n = 4;
  if (uVar4 < 4) {
    __n = (size_type)uVar4;
  }
  local_b4 = (undefined4)__n;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_80,__n,(allocator_type *)&local_c0);
  ptVar7 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar8 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar5 = 0;
    do {
      ptVar7 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0._M_id._M_thread = (id)0;
      local_c0 = (long *)operator_new(0x70);
      *local_c0 = (long)&PTR___State_00122ce8;
      *(undefined4 *)(local_c0 + 1) = (undefined4)local_68;
      *(undefined4 *)((long)local_c0 + 0xc) = local_68._4_4_;
      *(undefined4 *)(local_c0 + 2) = (undefined4)uStack_60;
      *(undefined4 *)((long)local_c0 + 0x14) = uStack_60._4_4_;
      *(int *)(local_c0 + 3) = (int)lVar5;
      local_c0[4] = (long)local_ac;
      local_c0[5] = (long)&local_b4;
      local_c0[6] = (long)waveform1;
      local_c0[7] = CONCAT44(in_register_00000014,is0);
      local_c0[8] = (long)&local_b0;
      local_c0[9] = (long)&local_a4;
      local_c0[10] = (long)&local_a8;
      local_c0[0xb] = (long)&local_58;
      local_c0[0xc] = (long)&local_98;
      local_c0[0xd] = (long)&local_90;
      std::thread::_M_start_thread(&local_a0,&local_c0,0);
      if (local_c0 != (long *)0x0) {
        (**(code **)(*local_c0 + 8))();
      }
      if (ptVar7[lVar5]._M_id._M_thread != 0) {
        std::terminate();
      }
      ptVar7[lVar5]._M_id._M_thread = (native_handle_type)local_a0._M_id._M_thread;
      lVar5 = lVar5 + 1;
      ptVar7 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar8 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (lVar5 < (int)((ulong)((long)local_80.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_80.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  for (; _Var3.super__Head_base<1UL,_long,_false>._M_head_impl =
              local_88.super__Head_base<1UL,_long,_false>._M_head_impl, ptVar7 != ptVar8;
      ptVar7 = ptVar7 + 1) {
    std::thread::join();
  }
  *(undefined8 *)local_88.super__Head_base<1UL,_long,_false>._M_head_impl = local_90;
  *(pointer *)((long)local_88.super__Head_base<1UL,_long,_false>._M_head_impl + 8) = local_98;
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_80);
  tVar9.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl._4_4_
       = extraout_XMM0_Db;
  tVar9.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl._0_4_
       = extraout_XMM0_Da;
  tVar9.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       _Var3.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<double,_long>)tVar9.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TKeyWaveformF & waveform0,
    const TKeyWaveformF & waveform1,
    int is0, int is1,
    int alignWindow) {
    TOffset besto = -1;
    TValueCC bestcc = -1.0f;

    int is00 = waveform0.size()/2 - (is1 - is0)/2;
    auto ret = calcSum(waveform0, is00, is00 + is1 - is0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(4, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::min(4u, std::thread::hardware_concurrency());
    std::mutex mutex;
    std::vector<std::thread> workers(nWorkers);
    for (int i = 0; i < (int) workers.size(); ++i) {
        auto & worker = workers[i];
        worker = std::thread([&, sum0 = sum0, sum02 = sum02, i]() {
            TOffset cbesto = -1;
            TValueCC cbestcc = -1.0f;

            for (int o = -alignWindow + i; o <= alignWindow; o += nWorkers) {
                auto cc = calcCC(waveform0, waveform1, sum0, sum02, is00, is0 + o, is1 + o);
                if (cc > cbestcc) {
                    cbesto = o;
                    cbestcc = cc;
                }
            }

            {
                std::lock_guard<std::mutex> lock(mutex);
                if (cbestcc > bestcc) {
                    bestcc = cbestcc;
                    besto = cbesto;
                }
            }
        });
    }
    for (auto & worker : workers) worker.join();
#endif

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}